

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O0

void unpredict_and_reorder(void *out,void *scratch,uint64_t packedbytes)

{
  int8_t *piVar1;
  int8_t *piVar2;
  int d;
  int8_t *stop;
  int8_t *s;
  int8_t *t2;
  int8_t *t1;
  uint64_t packedbytes_local;
  void *scratch_local;
  void *out_local;
  
  for (t1 = (int8_t *)((long)scratch + 1); t1 < (int8_t *)((long)scratch + packedbytes); t1 = t1 + 1
      ) {
    *t1 = t1[-1] + *t1 + -0x80;
  }
  piVar2 = (int8_t *)out;
  t2 = (int8_t *)((long)scratch + (packedbytes + 1 >> 1));
  t1 = (int8_t *)scratch;
  while (s = piVar2, s < (int8_t *)((long)out + packedbytes)) {
    piVar1 = t1 + 1;
    piVar2 = s + 1;
    *s = *t1;
    t1 = piVar1;
    if (piVar2 < (int8_t *)((long)out + packedbytes)) {
      *piVar2 = *t2;
      piVar2 = s + 2;
      t2 = t2 + 1;
    }
  }
  return;
}

Assistant:

static void
unpredict_and_reorder (void* out, void* scratch, uint64_t packedbytes)
{
    int8_t*       t1   = scratch;
    int8_t*       t2   = t1 + (packedbytes + 1) / 2;
    int8_t*       s    = out;
    const int8_t* stop = t1 + packedbytes;

    ++t1;
    while (t1 < stop)
    {
        int d = (int) (t1[-1]) + (int) (t1[0]) - 128;
        t1[0] = (int8_t) d;
        ++t1;
    }

    t1   = scratch;
    stop = s + packedbytes;
    while (s < stop)
    {
        *(s++) = *(t1++);
        if (s < stop) *(s++) = *(t2++);
    }
}